

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

int Sfm_TimCriticalPath(Sfm_Tim_t *p,int Window)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int *piVar2;
  uint uVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  Abc_Ntk_t *pAVar9;
  long lVar10;
  
  iVar1 = p->Delay;
  (p->vPath).nSize = 0;
  pAVar9 = p->pNtk;
  if ((pAVar9->vTravIds).pArray == (int *)0x0) {
    iVar7 = pAVar9->vObjs->nSize;
    uVar6 = (long)iVar7 + 500;
    iVar8 = (int)uVar6;
    if ((pAVar9->vTravIds).nCap < iVar8) {
      piVar4 = (int *)malloc(uVar6 * 4);
      (pAVar9->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar9->vTravIds).nCap = iVar8;
    }
    else {
      piVar4 = (int *)0x0;
    }
    if (-500 < iVar7) {
      memset(piVar4,0,(uVar6 & 0xffffffff) << 2);
    }
    (pAVar9->vTravIds).nSize = iVar8;
  }
  iVar7 = pAVar9->nTravIds;
  pAVar9->nTravIds = iVar7 + 1;
  if (0x3ffffffe < iVar7) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar5 = pAVar9->vCos;
  if (0 < pVVar5->nSize) {
    iVar1 = (Window * iVar1) / 100;
    lVar10 = 0;
    do {
      pObj = *(Abc_Obj_t **)
              (*(long *)(*(long *)(*pVVar5->pArray[lVar10] + 0x20) + 8) +
              (long)**(int **)((long)pVVar5->pArray[lVar10] + 0x20) * 8);
      uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
      if (((uVar3 != 2) && (uVar3 != 5)) && ((pObj->vFanins).nSize != 0)) {
        if (uVar3 != 7) {
          __assert_fail("Abc_ObjIsNode(pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                        ,0xb7,"int Sfm_TimCriticalPath(Sfm_Tim_t *, int)");
        }
        uVar3 = pObj->Id;
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (((p->vTimReqs).nSize <= (int)(uVar3 * 2)) || ((p->vTimArrs).nSize <= (int)(uVar3 * 2)))
        {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar4 = (p->vTimArrs).pArray;
        piVar2 = (p->vTimReqs).pArray;
        iVar8 = piVar2[uVar6 * 2] - piVar4[uVar6 * 2];
        iVar7 = piVar2[uVar6 * 2 + 1] - piVar4[uVar6 * 2 + 1];
        if (iVar8 < iVar7) {
          iVar7 = iVar8;
        }
        if (iVar7 <= iVar1) {
          Sfm_TimCriticalPath_int(p,pObj,&p->vPath,iVar1);
          pAVar9 = p->pNtk;
        }
      }
      lVar10 = lVar10 + 1;
      pVVar5 = pAVar9->vCos;
    } while (lVar10 < pVVar5->nSize);
  }
  return (p->vPath).nSize;
}

Assistant:

int Sfm_TimCriticalPath( Sfm_Tim_t * p, int Window )
{
    int i, SlackMax = p->Delay * Window / 100;
    Abc_Obj_t * pObj, * pNext; 
    Vec_IntClear( &p->vPath );
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        pNext = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, &p->vPath, SlackMax );
    }
    return Vec_IntSize(&p->vPath);
}